

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::TransformMapping3D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TransformMapping3D *this)

{
  Transform *in_RCX;
  
  StringPrintf<pbrt::Transform_const&>
            (__return_storage_ptr__,(pbrt *)"[ TransformMapping3D textureFromRender: %s ]",
             (char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string TransformMapping3D::ToString() const {
    return StringPrintf("[ TransformMapping3D textureFromRender: %s ]",
                        textureFromRender);
}